

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

gdImagePtr gdImageCreateTrueColor(int sx,int sy)

{
  int iVar1;
  int **ppiVar2;
  int *piVar3;
  gdImagePtr im;
  int i;
  int sy_local;
  int sx_local;
  
  iVar1 = overflow2(sx,sy);
  if (iVar1 == 0) {
    iVar1 = overflow2(8,sy);
    if (iVar1 == 0) {
      iVar1 = overflow2(4,sx);
      if (iVar1 == 0) {
        _sy_local = (gdImagePtr)gdMalloc(0x1ca8);
        if (_sy_local == (gdImagePtr)0x0) {
          _sy_local = (gdImagePtr)0x0;
        }
        else {
          memset(_sy_local,0,0x1ca8);
          ppiVar2 = (int **)gdMalloc((long)sy << 3);
          _sy_local->tpixels = ppiVar2;
          if (_sy_local->tpixels == (int **)0x0) {
            gdFree(_sy_local);
            _sy_local = (gdImagePtr)0x0;
          }
          else {
            _sy_local->polyInts = (int *)0x0;
            _sy_local->polyAllocated = 0;
            _sy_local->brush = (gdImageStruct *)0x0;
            _sy_local->tile = (gdImageStruct *)0x0;
            _sy_local->style = (int *)0x0;
            for (im._4_4_ = 0; im._4_4_ < sy; im._4_4_ = im._4_4_ + 1) {
              piVar3 = (int *)gdCalloc((long)sx,4);
              _sy_local->tpixels[im._4_4_] = piVar3;
              if (_sy_local->tpixels[im._4_4_] == (int *)0x0) {
                while (im._4_4_ = im._4_4_ + -1, -1 < im._4_4_) {
                  gdFree(_sy_local->tpixels[im._4_4_]);
                }
                gdFree(_sy_local->tpixels);
                gdFree(_sy_local);
                return (gdImagePtr)0x0;
              }
            }
            _sy_local->sx = sx;
            _sy_local->sy = sy;
            _sy_local->transparent = -1;
            _sy_local->interlace = 0;
            _sy_local->trueColor = 1;
            _sy_local->saveAlphaFlag = 0;
            _sy_local->alphaBlendingFlag = 1;
            _sy_local->thick = 1;
            _sy_local->AA = 0;
            _sy_local->cx1 = 0;
            _sy_local->cy1 = 0;
            _sy_local->cx2 = _sy_local->sx + -1;
            _sy_local->cy2 = _sy_local->sy + -1;
            _sy_local->res_x = 0x60;
            _sy_local->res_y = 0x60;
            _sy_local->interpolation = (interpolation_method)0x0;
            _sy_local->interpolation_id = GD_BILINEAR_FIXED;
          }
        }
      }
      else {
        _sy_local = (gdImagePtr)0x0;
      }
    }
    else {
      _sy_local = (gdImagePtr)0x0;
    }
  }
  else {
    _sy_local = (gdImagePtr)0x0;
  }
  return _sy_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateTrueColor (int sx, int sy)
{
	int i;
	gdImagePtr im;

	if (overflow2(sx, sy)) {
		return NULL;
	}
	if (overflow2(sizeof (int *), sy)) {
		return 0;
	}
	if (overflow2(sizeof(int), sx)) {
		return NULL;
	}

	im = (gdImage *) gdMalloc (sizeof (gdImage));
	if (!im) {
		return 0;
	}
	memset (im, 0, sizeof (gdImage));

	im->tpixels = (int **) gdMalloc (sizeof (int *) * sy);
	if (!im->tpixels) {
		gdFree(im);
		return 0;
	}
	im->polyInts = 0;
	im->polyAllocated = 0;
	im->brush = 0;
	im->tile = 0;
	im->style = 0;
	for (i = 0; (i < sy); i++) {
		im->tpixels[i] = (int *) gdCalloc (sx, sizeof (int));
		if (!im->tpixels[i]) {
			/* 2.0.34 */
			i--;
			while (i >= 0) {
				gdFree(im->tpixels[i]);
				i--;
			}
			gdFree(im->tpixels);
			gdFree(im);
			return 0;
		}
	}
	im->sx = sx;
	im->sy = sy;
	im->transparent = (-1);
	im->interlace = 0;
	im->trueColor = 1;
	/* 2.0.2: alpha blending is now on by default, and saving of alpha is
	   off by default. This allows font antialiasing to work as expected
	   on the first try in JPEGs -- quite important -- and also allows
	   for smaller PNGs when saving of alpha channel is not really
	   desired, which it usually isn't! */
	im->saveAlphaFlag = 0;
	im->alphaBlendingFlag = 1;
	im->thick = 1;
	im->AA = 0;
	im->cx1 = 0;
	im->cy1 = 0;
	im->cx2 = im->sx - 1;
	im->cy2 = im->sy - 1;
	im->res_x = GD_RESOLUTION;
	im->res_y = GD_RESOLUTION;
	im->interpolation = NULL;
	im->interpolation_id = GD_BILINEAR_FIXED;
	return im;
}